

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O2

string * __thiscall
IntegerInstance::op_isGreaterThan
          (string *__return_storage_ptr__,IntegerInstance *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  string *str;
  bool bVar1;
  undefined8 *puVar2;
  char *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  enable_shared_from_this<Instance> *__r;
  allocator local_49;
  shared_ptr<Instance> local_48;
  undefined1 local_38 [32];
  
  str = (arguments->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(arguments->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)str != 0x20) {
    puVar2 = (undefined8 *)__cxa_allocate_exception(8);
    pcVar3 = "RuntimeError: wrong number of arguments.";
LAB_00151e3c:
    *puVar2 = pcVar3;
    __cxa_throw(puVar2,&char_const*::typeinfo,0);
  }
  bVar1 = Grammar::is_integer_value(str);
  if (!bVar1) {
    bVar1 = Grammar::is_float_value
                      ((arguments->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start);
    if (!bVar1) {
      puVar2 = (undefined8 *)__cxa_allocate_exception(8);
      pcVar3 = "RuntimeError: invalid argument.";
      goto LAB_00151e3c;
    }
  }
  bVar1 = Grammar::is_integer_value
                    ((arguments->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start);
  __r = &(this->super_Instance).super_enable_shared_from_this<Instance>;
  if (bVar1) {
    std::__shared_ptr<Instance,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Instance,void>
              ((__shared_ptr<Instance,(__gnu_cxx::_Lock_policy)2> *)&local_48,
               (__weak_ptr<Instance,_(__gnu_cxx::_Lock_policy)2> *)__r);
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38;
    std::make_shared<IntegerInstance,std::__cxx11::string_const&>(pbVar4);
    local_38._16_8_ = local_38._0_8_;
    local_38._24_8_ = local_38._8_8_;
    local_38._0_8_ = (pointer)0x0;
    local_38._8_8_ = 0;
    bVar1 = InstanceIsGreaterThanComparator::operator()
                      ((InstanceIsGreaterThanComparator *)pbVar4,&local_48,
                       (shared_ptr<Instance> *)(local_38 + 0x10));
    pcVar3 = "false";
    if (bVar1) {
      pcVar3 = "true";
    }
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,&local_49);
  }
  else {
    std::__shared_ptr<Instance,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Instance,void>
              ((__shared_ptr<Instance,(__gnu_cxx::_Lock_policy)2> *)&local_48,
               (__weak_ptr<Instance,_(__gnu_cxx::_Lock_policy)2> *)__r);
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38;
    std::make_shared<FloatInstance,std::__cxx11::string_const&>(pbVar4);
    local_38._16_8_ = local_38._0_8_;
    local_38._24_8_ = local_38._8_8_;
    local_38._0_8_ = (pointer)0x0;
    local_38._8_8_ = 0;
    bVar1 = InstanceIsGreaterThanComparator::operator()
                      ((InstanceIsGreaterThanComparator *)pbVar4,&local_48,
                       (shared_ptr<Instance> *)(local_38 + 0x10));
    pcVar3 = "false";
    if (bVar1) {
      pcVar3 = "true";
    }
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,&local_49);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_38 + 0x18));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_38 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_48.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

std::string IntegerInstance::op_isGreaterThan(const std::vector<std::string>& arguments) {
    if (arguments.size() != 1)
        throw EXC_WRONG_NUMBER_OF_ARGUMENTS;
    if (!Grammar::is_integer_value(arguments[0]) && !Grammar::is_float_value(arguments[0]))
        throw EXC_INVALID_ARGUMENT;
    if (Grammar::is_integer_value(arguments[0]))
        return InstanceIsGreaterThanComparator()(shared_from_this(), std::make_shared<IntegerInstance>(arguments[0])) ?
               "true" : "false";
    return InstanceIsGreaterThanComparator()(shared_from_this(), std::make_shared<FloatInstance>(arguments[0])) ?
           "true" : "false";
}